

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

void __thiscall
vkb::detail::GenericFeatureChain::combine(GenericFeatureChain *this,GenericFeatureChain *right)

{
  bool bVar1;
  bool bVar2;
  reference right_00;
  reference this_00;
  GenericFeaturesPNextNode *left_node;
  iterator __end3;
  iterator __begin3;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  *__range3;
  bool already_contained;
  GenericFeaturesPNextNode *right_node;
  const_iterator __end2;
  const_iterator __begin2;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  *__range2;
  GenericFeatureChain *right_local;
  GenericFeatureChain *this_local;
  
  __end2 = std::
           vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ::begin(&right->nodes);
  right_node = (GenericFeaturesPNextNode *)
               std::
               vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
               ::end(&right->nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
                                *)&right_node);
    if (!bVar1) break;
    right_00 = __gnu_cxx::
               __normal_iterator<const_vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
               ::operator*(&__end2);
    bVar1 = false;
    __end3 = std::
             vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
             ::begin(&this->nodes);
    left_node = (GenericFeaturesPNextNode *)
                std::
                vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                ::end(&this->nodes);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
                                  *)&left_node);
      if (!bVar2) break;
      this_00 = __gnu_cxx::
                __normal_iterator<vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
                ::operator*(&__end3);
      if (this_00->sType == right_00->sType) {
        GenericFeaturesPNextNode::combine(this_00,right_00);
        bVar1 = true;
      }
      __gnu_cxx::
      __normal_iterator<vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
      ::operator++(&__end3);
    }
    if (!bVar1) {
      std::
      vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ::push_back(&this->nodes,right_00);
    }
    __gnu_cxx::
    __normal_iterator<const_vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void GenericFeatureChain::combine(GenericFeatureChain const& right) noexcept {
    for (const auto& right_node : right.nodes) {
        bool already_contained = false;
        for (auto& left_node : nodes) {
            if (left_node.sType == right_node.sType) {
                left_node.combine(right_node);
                already_contained = true;
            }
        }
        if (!already_contained) {
            nodes.push_back(right_node);
        }
    }
}